

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMeshControl::BuildWrapMesh(TPZMHMeshControl *this,int dim)

{
  uint uVar1;
  long lVar2;
  TPZGeoEl *pTVar3;
  TPZGeoMesh *pTVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  TPZGeoEl **ppTVar8;
  ostream *this_00;
  long *plVar9;
  long nelem;
  int64_t iVar10;
  int iVar11;
  TPZGeoElSide gelside;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide neighbour;
  ofstream outvtk;
  TPZAutoPointer<TPZGeoMesh> local_518;
  int local_510;
  int local_50c;
  TPZGeoElSide local_508;
  undefined1 local_4f0 [8];
  TPZGeoEl *local_4e8;
  int local_4e0;
  int64_t local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  TPZGeoElSide local_4c0;
  TPZGeoElSide local_4a8;
  TPZGeoElSide local_490;
  TPZGeoElSide local_478;
  TPZGeoElSide local_460;
  TPZGeoElSide local_448;
  undefined **local_430;
  TPZGeoEl *local_428;
  int local_420;
  undefined1 auStack_338 [264];
  undefined **local_230;
  TPZGeoEl *local_228;
  int local_220;
  undefined1 auStack_138 [264];
  
  lVar2 = (((this->fGMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.
          fNElements;
  if (0 < lVar2) {
    iVar5 = dim + -1;
    iVar10 = 0;
    do {
      ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,iVar10);
      pTVar3 = *ppTVar8;
      if (((pTVar3 != (TPZGeoEl *)0x0) &&
          (iVar6 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3), iVar6 == dim)) &&
         (iVar6 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3), 0 < iVar6)) {
        iVar11 = 0;
        do {
          iVar7 = (**(code **)(*(long *)pTVar3 + 0x208))(pTVar3,iVar11);
          if (iVar7 == iVar5) {
            (**(code **)(*(long *)pTVar3 + 0x188))(&local_430,pTVar3,iVar11);
            while ((local_428 != pTVar3 || (local_420 != iVar11))) {
              if (local_428->fMatId == this->fBoundaryWrapMatId) {
                local_478.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_018f8760;
                local_478.fGeoEl = pTVar3;
                local_478.fSide = iVar11;
                iVar7 = HasWrapNeighbour(this,&local_478);
                if (iVar7 != this->fBoundaryWrapMatId && iVar7 != 0) {
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                             ,0x8d7);
                }
                local_490.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_018f8760;
                local_490.fGeoEl = pTVar3;
                local_490.fSide = iVar11;
                CreateWrap(this,&local_490,this->fBoundaryWrapMatId);
              }
              if (local_428 == (TPZGeoEl *)0x0) {
                local_230 = &PTR__TPZGeoElSide_018f8760;
                local_228 = (TPZGeoEl *)0x0;
                local_220 = -1;
              }
              else {
                (**(code **)(*(long *)local_428 + 0x188))(&local_230,local_428,local_420);
              }
              local_428 = local_228;
              local_420 = local_220;
            }
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar6);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != lVar2);
    if (0 < lVar2) {
      local_4d0 = auStack_138;
      local_4c8 = auStack_338;
      iVar10 = 0;
      do {
        local_4d8 = iVar10;
        ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                              super_TPZChunkVector<TPZGeoEl_*,_10>,iVar10);
        pTVar3 = *ppTVar8;
        if (((pTVar3 != (TPZGeoEl *)0x0) &&
            (iVar6 = (**(code **)(*(long *)pTVar3 + 0x210))(), iVar6 == dim)) &&
           (local_50c = (**(code **)(*(long *)pTVar3 + 0xf0))(), 0 < local_50c)) {
          iVar6 = 0;
          do {
            iVar11 = (**(code **)(*(long *)pTVar3 + 0x208))(pTVar3,iVar6);
            if (iVar11 == iVar5) {
              local_508.super_TPZSavable._vptr_TPZSavable =
                   (_func_int **)&PTR__TPZGeoElSide_018f8760;
              local_510 = iVar6;
              local_508.fGeoEl = pTVar3;
              local_508.fSide = iVar6;
              (**(code **)(*(long *)pTVar3 + 0x188))(local_4f0,pTVar3,iVar6);
              while ((local_4e8 != local_508.fGeoEl ||
                     (iVar6 = local_510, local_4e0 != local_508.fSide))) {
                uVar1 = local_4e8->fMatId;
                iVar6 = (*this->_vptr_TPZMHMeshControl[9])(this,(ulong)uVar1);
                if ((char)iVar6 != '\0') {
                  local_448.super_TPZSavable._vptr_TPZSavable =
                       (_func_int **)&PTR__TPZGeoElSide_018f8760;
                  local_448.fSide = local_508.fSide;
                  local_448.fGeoEl = local_508.fGeoEl;
                  iVar6 = HasWrapNeighbour(this,&local_448);
                  if (((iVar6 != 0) && (iVar6 != this->fSkeletonWrapMatId)) &&
                     (iVar6 != this->fBoundaryWrapMatId)) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"neighbour is skeleton with matid ",0x21);
                    this_00 = (ostream *)std::ostream::operator<<(&std::cout,uVar1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (this_00," but the element has a wrap neighbour with matid ",0x31);
                    plVar9 = (long *)std::ostream::operator<<(this_00,iVar6);
                    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
                    std::ostream::put((char)plVar9);
                    std::ostream::flush();
                    TPZGeoElSide::Print(&local_508,(ostream *)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                    std::ostream::put(-0x58);
                    std::ostream::flush();
                    (**(code **)(*(long *)local_508.fGeoEl + 0x1a0))(local_508.fGeoEl,&std::cout);
                    std::ofstream::ofstream(&local_430,"gmesh.txt",_S_out);
                    pTVar4 = ((this->fGMesh).fRef)->fPointer;
                    (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[9])(pTVar4,&local_430);
                    std::ofstream::ofstream((ofstream *)&local_230,"gmesh.vtk",_S_out);
                    local_518.fRef = (this->fGMesh).fRef;
                    LOCK();
                    ((local_518.fRef)->fCounter).super___atomic_base<int>._M_i =
                         ((local_518.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                    TPZVTKGeoMesh::PrintGMeshVTK
                              ((local_518.fRef)->fPointer,(ofstream *)&local_230,true,false);
                    TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer(&local_518);
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                               ,0x8fd);
                  }
                  if (iVar6 == 0) {
                    local_460.super_TPZSavable._vptr_TPZSavable =
                         (_func_int **)&PTR__TPZGeoElSide_018f8760;
                    local_460.fSide = local_4e0;
                    local_460.fGeoEl = local_4e8;
                    CreateWrap(this,&local_460,this->fSkeletonWrapMatId);
                  }
                }
                if (local_4e8 == (TPZGeoEl *)0x0) {
                  local_430 = &PTR__TPZGeoElSide_018f8760;
                  local_428 = (TPZGeoEl *)0x0;
                  local_420 = -1;
                }
                else {
                  (**(code **)(*(long *)local_4e8 + 0x188))(&local_430,local_4e8,local_4e0);
                }
                local_4e8 = local_428;
                local_4e0 = local_420;
              }
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 != local_50c);
        }
        iVar10 = local_4d8 + 1;
      } while (iVar10 != lVar2);
      if (0 < lVar2) {
        nelem = 0;
        do {
          ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                              (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                                super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
          pTVar3 = *ppTVar8;
          if (((pTVar3 != (TPZGeoEl *)0x0) &&
              (iVar6 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3), iVar6 == dim)) &&
             (iVar6 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3), 0 < iVar6)) {
            iVar11 = 0;
            do {
              iVar7 = (**(code **)(*(long *)pTVar3 + 0x208))(pTVar3,iVar11);
              if (iVar7 == iVar5) {
                local_4a8.super_TPZSavable._vptr_TPZSavable =
                     (_func_int **)&PTR__TPZGeoElSide_018f8760;
                local_4a8.fGeoEl = pTVar3;
                local_4a8.fSide = iVar11;
                iVar7 = HasWrapNeighbour(this,&local_4a8);
                if (iVar7 == 0) {
                  local_4c0.super_TPZSavable._vptr_TPZSavable =
                       (_func_int **)&PTR__TPZGeoElSide_018f8760;
                  local_4c0.fGeoEl = pTVar3;
                  local_4c0.fSide = iVar11;
                  CreateWrap(this,&local_4c0);
                }
              }
              iVar11 = iVar11 + 1;
            } while (iVar6 != iVar11);
          }
          nelem = nelem + 1;
        } while (nelem != lVar2);
      }
    }
  }
  return;
}

Assistant:

void TPZMHMeshControl::BuildWrapMesh(int dim)
{
    // all the elements should be neighbour of a wrap element
    int64_t nel = fGMesh->NElements();
  
//    int meshdim = fGMesh->Dimension();
// first create the neighbours of boundary elements (works for dim = fGMesh->Dimension()-2)
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->MaterialId() == fBoundaryWrapMatId) {
                    int wrapmat = HasWrapNeighbour(gelside);
                    if (wrapmat && wrapmat != fBoundaryWrapMatId) {
                        DebugStop();
                    }
                    else
                    {
                        CreateWrap(gelside,fBoundaryWrapMatId);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }
    // create the wrap elements around the skeleton elements
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                int neighmatid = neighbour.Element()->MaterialId();
                if (IsSkeletonMatid(neighmatid)) {
                    int wrapmat = HasWrapNeighbour(gelside);
                    if (wrapmat && wrapmat != fSkeletonWrapMatId && wrapmat != fBoundaryWrapMatId) {
                        std::cout << "neighbour is skeleton with matid " << neighmatid <<
                        " but the element has a wrap neighbour with matid " << wrapmat << std::endl;
                        gelside.Print(std::cout);
                        std::cout << std::endl;
                        gelside.Element()->Print(std::cout);
                        std::ofstream out("gmesh.txt");
                        fGMesh->Print(out);
                        std::ofstream outvtk("gmesh.vtk");
                        TPZVTKGeoMesh::PrintGMeshVTK(fGMesh,outvtk);
                        DebugStop();
                    }
                    else if(!wrapmat)
                    {
                        CreateWrap(neighbour,fSkeletonWrapMatId);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            if (!HasWrapNeighbour(gelside)) {
                CreateWrap(gelside);
            }
        }
    }
}